

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

Expression * __thiscall Minus::assign(Minus *this,string *var,Expression *expression)

{
  Expression *pEVar1;
  int iVar2;
  int iVar3;
  Minus *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string local_70 [48];
  string local_40 [32];
  Expression *local_20;
  Expression *expression_local;
  string *var_local;
  Minus *this_local;
  
  local_20 = expression;
  expression_local = (Expression *)var;
  var_local = (string *)this;
  this_00 = (Minus *)operator_new(0x18);
  pEVar1 = this->left;
  std::__cxx11::string::string(local_40,(string *)var);
  iVar2 = (*pEVar1->_vptr_Expression[2])(pEVar1,local_40,local_20);
  pEVar1 = this->right;
  std::__cxx11::string::string(local_70,(string *)var);
  iVar3 = (*pEVar1->_vptr_Expression[2])(pEVar1,local_70,local_20);
  Minus(this_00,(Expression *)CONCAT44(extraout_var,iVar2),
        (Expression *)CONCAT44(extraout_var_00,iVar3));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_40);
  return &this_00->super_Expression;
}

Assistant:

Expression *Minus::assign(string var, Expression *expression) {
    return new Minus(left->assign(var, expression), right->assign(var, expression));
}